

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_location.cpp
# Opt level: O0

void __thiscall
Am_Inter_Location::Swap_With(Am_Inter_Location *this,Am_Inter_Location *other_obj,bool make_unique)

{
  Am_Object local_50 [3];
  int local_38;
  int local_34;
  int d;
  int c;
  int b;
  int a;
  Am_Object tmp_ref_obj;
  bool tmp_as_line;
  bool make_unique_local;
  Am_Inter_Location *other_obj_local;
  Am_Inter_Location *this_local;
  
  tmp_ref_obj.data._7_1_ = make_unique;
  Am_Object::Am_Object((Am_Object *)&b);
  Get_Location(this,(bool *)((long)&tmp_ref_obj.data + 6),(Am_Object *)&b,&c,&d,&local_34,&local_38)
  ;
  Copy_From(this,other_obj,(bool)(tmp_ref_obj.data._7_1_ & 1));
  Am_Object::Am_Object(local_50,(Am_Object *)&b);
  Set_Location(other_obj,(bool)(tmp_ref_obj.data._6_1_ & 1),local_50,c,d,local_34,local_38,
               (bool)(tmp_ref_obj.data._7_1_ & 1));
  Am_Object::~Am_Object(local_50);
  Am_Object::~Am_Object((Am_Object *)&b);
  return;
}

Assistant:

void
Am_Inter_Location::Swap_With(Am_Inter_Location &other_obj, bool make_unique)
{
  bool tmp_as_line;
  Am_Object tmp_ref_obj;
  int a, b, c, d;
  Get_Location(tmp_as_line, tmp_ref_obj, a, b, c, d);
  Copy_From(other_obj, make_unique);
  other_obj.Set_Location(tmp_as_line, tmp_ref_obj, a, b, c, d, make_unique);
}